

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_uload(jit_State *J)

{
  IRIns *refa;
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  bool bVar4;
  AliasRet AVar5;
  int iVar6;
  TRef TVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint local_3c;
  
  uVar1 = (J->fold).ins.field_0.op1;
  pIVar3 = (J->cur).ir;
  refa = pIVar3 + uVar1;
  uVar10 = (uint)J->chain[0x4c];
  uVar8 = 0x8000;
  do {
    if (uVar10 <= uVar8) goto LAB_00126315;
    uVar9 = (ulong)uVar10;
    AVar5 = aa_uref(refa,pIVar3 + pIVar3[uVar9].field_0.op1);
    if (AVar5 == ALIAS_MAY) {
      iVar6 = 5;
      uVar8 = uVar10;
    }
    else if (AVar5 == ALIAS_MUST) {
      local_3c = (uint)*(ushort *)((long)pIVar3 + uVar9 * 8 + 2);
      iVar6 = 1;
    }
    else {
      uVar10 = (uint)*(ushort *)((long)pIVar3 + uVar9 * 8 + 6);
      iVar6 = 0;
    }
  } while (iVar6 == 0);
  if (iVar6 == 5) {
LAB_00126315:
    uVar10 = (uint)J->chain[0x44];
    do {
      if (uVar10 <= uVar8) {
        TVar7 = lj_ir_emit(J);
        return TVar7;
      }
      uVar2 = pIVar3[uVar10].field_0.op1;
      if ((uVar2 == uVar1) ||
         ((pIVar3[uVar2].field_1.op12 == (refa->field_1).op12 &&
          (*(IROp1 *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) == (refa->field_1).o)))) {
        bVar4 = false;
        local_3c = uVar10;
      }
      else {
        uVar10 = (uint)*(ushort *)((long)pIVar3 + (ulong)uVar10 * 8 + 6);
        bVar4 = true;
      }
    } while (bVar4);
  }
  return local_3c;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_uload(jit_State *J)
{
  IRRef uref = fins->op1;
  IRRef lim = REF_BASE;  /* Search limit. */
  IRIns *xr = IR(uref);
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_USTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_ULOAD];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op1 == uref ||
	(IR(ir->op1)->op12 == IR(uref)->op12 && IR(ir->op1)->o == IR(uref)->o))
      return ref;  /* Match for identical or equal UREFx (non-CSEable UREFO). */
    ref = ir->prev;
  }
  return lj_ir_emit(J);
}